

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O1

string * __thiscall
efsw::FileInfo::linksTo_abi_cxx11_(string *__return_storage_ptr__,FileInfo *this)

{
  char *__s;
  size_t sVar1;
  
  if (((this->Permissions & 0xf000) == 0xa000) &&
     (__s = realpath((this->Filepath)._M_dataplus._M_p,(char *)0x0), __s != (char *)0x0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar1);
    free(__s);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string FileInfo::linksTo() {
#if EFSW_PLATFORM != EFSW_PLATFORM_WIN32
	if ( isLink() ) {
		char* ch = realpath( Filepath.c_str(), NULL );

		if ( NULL != ch ) {
			std::string tstr( ch );

			free( ch );

			return tstr;
		}
	}
#endif
	return std::string( "" );
}